

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

XMLCh * __thiscall xercesc_4_0::DOMNodeImpl::lookupPrefix(DOMNodeImpl *this,XMLCh *namespaceURI)

{
  DOMNodeImpl *currentNode;
  int iVar1;
  DOMNode *pDVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar3;
  DOMNodeImpl *this_00;
  
  if (namespaceURI != (XMLCh *)0x0) {
    currentNode = (DOMNodeImpl *)this->fContainingNode;
    this_00 = currentNode;
    iVar1 = (*(code *)currentNode->fContainingNode[4]._vptr_DOMNode)();
    switch((short)iVar1) {
    case 1:
      pXVar3 = lookupPrefix(this,namespaceURI,(DOMElement *)currentNode);
      return pXVar3;
    case 2:
      iVar1 = (*this->fOwnerNode->_vptr_DOMNode[4])();
      if (iVar1 == 1) {
        iVar1 = (*this->fOwnerNode->_vptr_DOMNode[0x23])(this->fOwnerNode,namespaceURI);
        return (XMLCh *)CONCAT44(extraout_var,iVar1);
      }
      break;
    default:
      pDVar2 = getElementAncestor(this_00,(DOMNode *)currentNode);
      if (pDVar2 != (DOMNode *)0x0) goto LAB_0027a6cc;
      break;
    case 6:
    case 10:
    case 0xb:
    case 0xc:
      break;
    case 9:
      iVar1 = (*(code *)currentNode[-1].fContainingNode[0xd]._vptr_DOMNode)(currentNode + -1);
      pDVar2 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
LAB_0027a6cc:
      iVar1 = (*pDVar2->_vptr_DOMNode[0x23])(pDVar2,namespaceURI);
      return (XMLCh *)CONCAT44(extraout_var_01,iVar1);
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh* DOMNodeImpl::lookupPrefix(const XMLCh* namespaceURI) const {
    // REVISIT: When Namespaces 1.1 comes out this may not be true
    // Prefix can't be bound to null namespace
    if (namespaceURI == 0) {
        return 0;
    }

    const DOMNode *thisNode = getContainingNode();

    short type = thisNode->getNodeType();

    switch (type) {
    case DOMNode::ELEMENT_NODE: {
        return lookupPrefix(namespaceURI, (DOMElement*)thisNode);
    }
    case DOMNode::DOCUMENT_NODE:{
        return ((DOMDocument*)thisNode)->getDocumentElement()->lookupPrefix(namespaceURI);
    }

    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return 0;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->lookupPrefix(namespaceURI);
        }
        return 0;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->lookupPrefix(namespaceURI);
        }
        return 0;
    }
    }
}